

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_lda_xc_cam_lda0.c
# Opt level: O2

void xc_hyb_lda_xc_cam_lda0_init(xc_func_type *p)

{
  double omega;
  double local_28 [3];
  
  omega = 0.3333333333333333;
  local_28[0] = 0.5;
  local_28[1] = 0.25;
  local_28[2] = 1.0;
  xc_mix_init(p,3,xc_hyb_lda_xc_cam_lda0_init::funcs_id,local_28);
  xc_func_set_ext_params(p->func_aux[1],&omega);
  xc_hyb_init_cam(p,0.5,-0.25,omega);
  return;
}

Assistant:

void
xc_hyb_lda_xc_cam_lda0_init(xc_func_type *p)
{
  static int funcs_id[3] = {XC_LDA_X, XC_LDA_X_ERF, XC_LDA_C_PW_MOD};
  double funcs_coef[3];
  double omega, exxglobal, exxlr;
  double alpha, beta;

  /* omega = 1/3 */
  omega = 1.0/3.0;
  /* 1/4 global exact exchange */
  exxglobal = 1.0/4.0;
  /* 1/2 long-range exact exchange */
  exxlr = 1.0/2.0;

  /* Convert to libxc parameters */
  alpha = exxlr;
  beta = exxglobal-exxlr;

  /* Calculate mixing coefficients: full LDA */
  funcs_coef[0] = 1.0 - alpha;
  funcs_coef[1] = -beta;
  funcs_coef[2] = 1.0;

  /* Initialize functional */
  xc_mix_init(p, 3, funcs_id, funcs_coef);

  /* Set parameters */
  xc_func_set_ext_params(p->func_aux[1], &omega);

  xc_hyb_init_cam(p, alpha, beta, omega);
}